

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall VmaMappingHysteresis::PostMap(VmaMappingHysteresis *this)

{
  uint uVar1;
  
  if (this->m_ExtraMapping != 0) {
    PostMinorCounter(this);
    return false;
  }
  uVar1 = this->m_MajorCounter + 1;
  this->m_MajorCounter = uVar1;
  if (6 < uVar1) {
    this->m_ExtraMapping = 1;
    this->m_MinorCounter = 0;
    this->m_MajorCounter = 0;
    return true;
  }
  return false;
}

Assistant:

bool PostMap()
    {
#if VMA_MAPPING_HYSTERESIS_ENABLED
        if(m_ExtraMapping == 0)
        {
            ++m_MajorCounter;
            if(m_MajorCounter >= COUNTER_MIN_EXTRA_MAPPING)
            {
                m_ExtraMapping = 1;
                m_MajorCounter = 0;
                m_MinorCounter = 0;
                return true;
            }
        }
        else // m_ExtraMapping == 1
            PostMinorCounter();
#endif // #if VMA_MAPPING_HYSTERESIS_ENABLED
        return false;
    }